

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O2

void __thiscall
Qentem::
HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
resize(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
       *this,SizeT new_size)

{
  SizeT *pointer;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *this_00;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar1;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar2;
  
  pointer = this->hashTable_;
  pHVar2 = (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)(pointer + this->capacity_);
  pHVar1 = pHVar2 + this->index_;
  this_00 = allocate(this,new_size);
  this->index_ = 0;
  for (; pHVar2 < pHVar1; pHVar2 = pHVar2 + 1) {
    if (pHVar2->Hash != 0) {
      HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>::HAItem_T(this_00,pHVar2);
      this->index_ = this->index_ + 1;
      this_00 = this_00 + 1;
    }
  }
  Memory::Deallocate(pointer);
  generateHash(this);
  return;
}

Assistant:

void resize(const SizeT new_size) {
        SizeT       *ht      = getHashTable();
        HItem       *item    = Storage();
        const HItem *end     = (item + Size());
        HItem       *storage = allocate(new_size);

        setSize(0);

        while (item < end) {
            if (item->Hash != 0) {
                Memory::Initialize(storage, Memory::Move(*item));
                ++storage;
                ++index_;
            }

            ++item;
        }

        Memory::Deallocate(ht);
        generateHash();
    }